

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O3

QMatrix * Transp_Q(QMatrix *Q)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Boolean BVar3;
  Real *pRVar4;
  Real *pRVar5;
  undefined1 auVar6 [16];
  ElType **ppEVar7;
  Boolean *pBVar8;
  QMatrixType *pQVar9;
  LASErrIdType LVar10;
  QMatrix *Q_00;
  char *pcVar11;
  size_t sVar12;
  char *Object1Name;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ElOrderType EVar17;
  
  Q_Lock(Q);
  LVar10 = LASResult();
  if (LVar10 != LASOK) {
    Q_00 = (QMatrix *)0x0;
    goto LAB_0010d3ef;
  }
  Q_00 = (QMatrix *)malloc(0xb0);
  pcVar11 = Q_GetName(Q);
  sVar12 = strlen(pcVar11);
  pcVar11 = (char *)malloc(sVar12 + 10);
  Object1Name = Q_GetName(Q);
  if (pcVar11 == (char *)0x0 || Q_00 == (QMatrix *)0x0) {
    LASError(LASMemAllocErr,"Transp_Q",Object1Name,(char *)0x0,(char *)0x0);
    if (Q_00 != (QMatrix *)0x0) {
      free(Q_00);
    }
    if (pcVar11 == (char *)0x0) goto LAB_0010d3ef;
  }
  else {
    sprintf(pcVar11,"(%s)^T",Object1Name);
    Q_Constr(Q_00,pcVar11,Q->Dim,Q->Symmetry,Q->ElOrder,Tempor,False);
    LVar10 = LASResult();
    if (LVar10 == LASOK) {
      if ((Q->Instance == Tempor) && (Q->OwnData != False)) {
        Q->OwnData = False;
        Q_00->OwnData = True;
      }
      if (Q->Symmetry == False) {
        lVar13 = 0x88;
        lVar14 = 0x90;
        lVar15 = 0x78;
        lVar16 = 0x80;
        if (Q->ElOrder == Rowws) {
          EVar17 = Clmws;
        }
        else {
          if (Q->ElOrder != Clmws) goto LAB_0010d376;
          EVar17 = Rowws;
        }
        Q_00->ElOrder = EVar17;
      }
      else {
        lVar13 = 0x78;
        lVar14 = 0x80;
        lVar15 = 0x88;
        lVar16 = 0x90;
      }
LAB_0010d376:
      Q_00->MultiplD = Q->MultiplD;
      uVar1 = Q->MultiplU;
      uVar2 = Q->MultiplL;
      auVar6._8_4_ = (int)uVar1;
      auVar6._0_8_ = uVar2;
      auVar6._12_4_ = (int)((ulong)uVar1 >> 0x20);
      Q_00->MultiplU = (double)uVar2;
      Q_00->MultiplL = (double)auVar6._8_8_;
      ppEVar7 = Q->El;
      Q_00->Len = Q->Len;
      Q_00->El = ppEVar7;
      pBVar8 = Q->DiagElAlloc;
      Q_00->ElSorted = Q->ElSorted;
      Q_00->DiagElAlloc = pBVar8;
      pBVar8 = Q->ZeroInDiag;
      Q_00->DiagEl = Q->DiagEl;
      Q_00->ZeroInDiag = pBVar8;
      Q_00->InvDiagEl = Q->InvDiagEl;
      pRVar4 = *(Real **)((long)&Q->Name + lVar16);
      BVar3 = *(Boolean *)((long)&Q->Name + lVar15);
      pRVar5 = *(Real **)((long)&Q->Name + lVar14);
      Q_00->UnitRightKer = *(Boolean *)((long)&Q->Name + lVar13);
      Q_00->RightKerCmp = pRVar5;
      Q_00->UnitLeftKer = BVar3;
      Q_00->LeftKerCmp = pRVar4;
      pQVar9 = Q->ILU;
      Q_00->ILUExists = Q->ILUExists;
      Q_00->ILU = pQVar9;
    }
  }
  free(pcVar11);
LAB_0010d3ef:
  Q_Unlock(Q);
  return Q_00;
}

Assistant:

QMatrix *Transp_Q(QMatrix *Q)
/* QRes = Q^T, returns transposed matrix Q */
{
    QMatrix *QRes;

    char *QResName;

    Q_Lock(Q);
    
    if (LASResult() == LASOK) {
        QRes = (QMatrix *)malloc(sizeof(QMatrix));
        QResName = (char *)malloc((strlen(Q_GetName(Q)) + 10) * sizeof(char));
        if (QRes != NULL && QResName != NULL) {
            sprintf(QResName, "(%s)^T", Q_GetName(Q));
            Q_Constr(QRes, QResName, Q->Dim, Q->Symmetry, Q->ElOrder, Tempor, False);
            if (LASResult() == LASOK) {
                if (Q->Instance == Tempor && Q->OwnData) {
                    Q->OwnData = False;
                    QRes->OwnData = True;
                }
                if (!Q->Symmetry) {
                    if (Q->ElOrder == Rowws)
                        QRes->ElOrder = Clmws;
                    if (Q->ElOrder == Clmws)
                        QRes->ElOrder = Rowws;
                }
                QRes->MultiplD = Q->MultiplD;
                QRes->MultiplU = Q->MultiplL;
                QRes->MultiplL = Q->MultiplU;
                QRes->Len = Q->Len;
                QRes->El = Q->El;
                QRes->ElSorted = Q->ElSorted;
                QRes->DiagElAlloc = Q->DiagElAlloc;
                QRes->DiagEl = Q->DiagEl;
                QRes->ZeroInDiag = Q->ZeroInDiag;
                QRes->InvDiagEl = Q->InvDiagEl;
                if (!Q->Symmetry) {
                    QRes->UnitRightKer = Q->UnitLeftKer;
                    QRes->RightKerCmp = Q->LeftKerCmp;
                    QRes->UnitLeftKer = Q->UnitRightKer;
                    QRes->LeftKerCmp = Q->RightKerCmp;
                } else {
                    QRes->UnitRightKer = Q->UnitRightKer;
                    QRes->RightKerCmp = Q->RightKerCmp;
                    QRes->UnitLeftKer = Q->UnitLeftKer;
                    QRes->LeftKerCmp = Q->LeftKerCmp;
                }
                QRes->ILUExists = Q->ILUExists;
                QRes->ILU = Q->ILU;
            }
        } else {
            LASError(LASMemAllocErr, "Transp_Q", Q_GetName(Q), NULL, NULL);
            if (QRes != NULL)
                free(QRes);
        }
            
        if (QResName != NULL)
            free(QResName);
    } else {
        QRes = NULL;
    }

    Q_Unlock(Q);

    return(QRes);
}